

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (ASTContext *context,ModportNamedPortSyntax *syntax,bool isExport)

{
  SubroutineSymbol *pSVar1;
  Compilation *this;
  MethodPrototypeSymbol *pMVar2;
  undefined7 in_register_00000011;
  bool in_R9B;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar3;
  Token nameToken;
  
  nameToken.info = CONCAT71(in_register_00000011,isExport) & 0xffffffff;
  nameToken._0_8_ = (syntax->name).info;
  pMVar2 = createForModport((MethodPrototypeSymbol *)(context->scope).ptr,(Scope *)syntax,
                            *(SyntaxNode **)&syntax->name,nameToken,in_R9B);
  if ((pMVar2->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged !=
      false) {
    pSVar1 = (pMVar2->subroutine).
             super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value;
    if (pSVar1 != (SubroutineSymbol *)0x0) {
      DeclaredType::setLink(&pMVar2->declaredReturnType,&pSVar1->declaredReturnType);
      pMVar2->subroutineKind = pSVar1->subroutineKind;
      this = ((context->scope).ptr)->compilation;
      if ((pSVar1->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar1->super_Scope);
      }
      sVar3._M_extent._M_extent_value = nameToken.info;
      sVar3._M_ptr = (pointer)(pSVar1->arguments)._M_extent._M_extent_value;
      sVar3 = cloneArguments((ast *)this,(Compilation *)&pMVar2->super_Scope,
                             (Scope *)(pSVar1->arguments)._M_ptr,sVar3);
      pMVar2->arguments = sVar3;
    }
    return pMVar2;
  }
  std::__throw_bad_optional_access();
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const ASTContext& context,
                                                         const ModportNamedPortSyntax& syntax,
                                                         bool isExport) {
    auto& result = createForModport(*context.scope, syntax, syntax.name, isExport);
    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.declaredReturnType.setLink(target->declaredReturnType);
    result.subroutineKind = target->subroutineKind;
    result.arguments = cloneArguments(context.getCompilation(), result, target->getArguments());
    return result;
}